

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O0

void Wln_NtkToNdrTest(Wln_Ntk_t *p)

{
  int iVar1;
  void *pDesign_00;
  char **pNames;
  char *pcVar2;
  int local_24;
  int i;
  char **ppNames;
  void *pDesign;
  Wln_Ntk_t *p_local;
  
  pDesign_00 = Wln_NtkToNdr(p);
  iVar1 = Wln_NtkObjNum(p);
  pNames = (char **)malloc((long)(iVar1 + 1) << 3);
  for (local_24 = 1; iVar1 = Wln_NtkObjNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    pcVar2 = Wln_ObjName(p,local_24);
    pcVar2 = Abc_UtilStrsav(pcVar2);
    pNames[local_24] = pcVar2;
  }
  Ndr_WriteVerilog((char *)0x0,pDesign_00,pNames);
  Ndr_Write("test.ndr",pDesign_00);
  Ndr_Delete(pDesign_00);
  for (local_24 = 1; iVar1 = Wln_NtkObjNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    if (pNames[local_24] != (char *)0x0) {
      free(pNames[local_24]);
      pNames[local_24] = (char *)0x0;
    }
  }
  if (pNames != (char **)0x0) {
    free(pNames);
  }
  return;
}

Assistant:

void Wln_NtkToNdrTest( Wln_Ntk_t * p )
{
    // transform
    void * pDesign = Wln_NtkToNdr( p );

    // collect names     
    char ** ppNames = ABC_ALLOC( char *, Wln_NtkObjNum(p) + 1 ); int i;
    Wln_NtkForEachObj( p, i ) 
        ppNames[i] = Abc_UtilStrsav(Wln_ObjName(p, i));

    // verify by writing Verilog
    Ndr_WriteVerilog( NULL, pDesign, ppNames );
    Ndr_Write( "test.ndr", pDesign );

    // cleanup
    Ndr_Delete( pDesign );
    Wln_NtkForEachObj( p, i ) 
        ABC_FREE( ppNames[i] );
    ABC_FREE( ppNames );
}